

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_1::oneWayComparePointSets
               (TestLog *log,Surface *errorDst,TessPrimitiveType primitiveType,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *subset,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *superset,
               char *subsetName,char *supersetName,RGBA *errorColor)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  Vector<float,_3> *pVVar7;
  Vector<float,_3> *pVVar8;
  pointer pVVar9;
  size_t sVar10;
  uint uVar11;
  pointer pVVar12;
  long lVar13;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  __i;
  long lVar14;
  Vector<float,_3> *pVVar15;
  pointer pVVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  bool bVar23;
  Vector<bool,_3> res_3;
  Vector<bool,_3> res_2;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> supersetSorted;
  Vec3 matchMin;
  char local_208 [8];
  int local_200;
  TessPrimitiveType local_1fc;
  float local_1f8 [4];
  TestLog *local_1e8;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_1e0;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_1d8;
  char *local_1c0;
  Surface *local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  local_1fc = primitiveType;
  local_1e8 = log;
  local_1e0 = subset;
  local_1c0 = subsetName;
  local_1b8 = errorDst;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&local_1d8,superset);
  pVVar16 = local_1d8.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar9 = local_1d8.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_1d8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1d8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar14 = (long)local_1d8.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1d8.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (lVar14 >> 2) * -0x5555555555555555;
    lVar22 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,3>const&,tcu::Vector<float,3>const&)>>
              ((__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                )local_1d8.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                )local_1d8.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar22 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_3>_&,_const_tcu::Vector<float,_3>_&)>
                 )0x14257c7);
    if (lVar14 < 0xc1) {
      pVVar15 = pVVar9 + 1;
      if (pVVar15 != pVVar16) {
        uVar6 = 0xc;
        pVVar12 = pVVar9;
        do {
          fVar1 = pVVar15->m_data[0];
          if (pVVar9->m_data[0] <= fVar1) {
            uVar3 = *(undefined8 *)(pVVar15->m_data + 1);
            fVar2 = pVVar12->m_data[0];
            pVVar8 = pVVar15;
            while (fVar1 < fVar2) {
              pVVar8->m_data[2] = pVVar8[-1].m_data[2];
              *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar8[-1].m_data;
              fVar2 = pVVar8[-2].m_data[0];
              pVVar8 = pVVar8 + -1;
            }
            pVVar8->m_data[0] = fVar1;
            *(undefined8 *)(pVVar8->m_data + 1) = uVar3;
          }
          else {
            local_1a8._0_4_ = pVVar15->m_data[2];
            local_1b0 = *(undefined1 (*) [8])pVVar15->m_data;
            if (pVVar15 != pVVar9 && -1 < (long)pVVar15 - (long)pVVar9) {
              lVar22 = uVar6 / 0xc + 1;
              pVVar8 = pVVar12;
              do {
                pVVar8[1].m_data[2] = pVVar8->m_data[2];
                *(undefined8 *)pVVar8[1].m_data = *(undefined8 *)pVVar8->m_data;
                lVar22 = lVar22 + -1;
                pVVar8 = pVVar8 + -1;
              } while (1 < lVar22);
            }
            pVVar9->m_data[2] = (float)local_1a8._0_4_;
            *(undefined1 (*) [8])pVVar9->m_data = local_1b0;
          }
          pVVar15 = pVVar15 + 1;
          uVar6 = uVar6 + 0xc;
          pVVar12 = pVVar12 + 1;
        } while (pVVar15 != pVVar16);
      }
    }
    else {
      pVVar15 = pVVar9 + 0x10;
      lVar22 = 0;
      pVVar8 = pVVar9 + 1;
      pVVar12 = pVVar9;
      do {
        pVVar7 = pVVar8;
        fVar1 = pVVar12[1].m_data[0];
        if (pVVar9->m_data[0] <= fVar1) {
          uVar3 = *(undefined8 *)(pVVar7->m_data + 1);
          fVar2 = pVVar12->m_data[0];
          pVVar8 = pVVar7;
          while (fVar1 < fVar2) {
            pVVar8->m_data[2] = pVVar8[-1].m_data[2];
            *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar8[-1].m_data;
            fVar2 = pVVar8[-2].m_data[0];
            pVVar8 = pVVar8 + -1;
          }
          pVVar8->m_data[0] = fVar1;
          *(undefined8 *)(pVVar8->m_data + 1) = uVar3;
        }
        else {
          local_1a8._0_4_ = pVVar7->m_data[2];
          local_1b0 = *(undefined1 (*) [8])pVVar7->m_data;
          if (pVVar7 != pVVar9 && -1 < (long)pVVar7 - (long)pVVar9) {
            memmove(pVVar9 + 1,pVVar9,lVar22 * 0xc + 0xc);
          }
          pVVar9->m_data[2] = (float)local_1a8._0_4_;
          *(undefined1 (*) [8])pVVar9->m_data = local_1b0;
        }
        lVar22 = lVar22 + 1;
        pVVar8 = pVVar7 + 1;
        pVVar12 = pVVar7;
      } while (pVVar7 + 1 != pVVar15);
      for (; pVVar15 != pVVar16; pVVar15 = pVVar15 + 1) {
        fVar1 = pVVar15->m_data[0];
        uVar3 = *(undefined8 *)(pVVar15->m_data + 1);
        fVar2 = pVVar15[-1].m_data[0];
        pVVar8 = pVVar15;
        while (fVar1 < fVar2) {
          pVVar8->m_data[2] = pVVar8[-1].m_data[2];
          *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar8[-1].m_data;
          fVar2 = pVVar8[-2].m_data[0];
          pVVar8 = pVVar8 + -1;
        }
        pVVar8->m_data[0] = fVar1;
        *(undefined8 *)(pVVar8->m_data + 1) = uVar3;
      }
    }
  }
  pVVar9 = (local_1e0->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(local_1e0->
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9) >> 2) *
      -0x55555555 < 1) {
    bVar23 = true;
  }
  else {
    lVar22 = 0;
    lVar14 = 0;
    iVar21 = 0;
    do {
      local_1a8._0_4_ = 0.0;
      local_1b0 = (undefined1  [8])0x0;
      lVar13 = 0;
      do {
        *(float *)(local_1b0 + lVar13 * 4) =
             *(float *)((long)pVVar9->m_data + lVar13 * 4 + lVar22) + -0.01;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      local_1f8[2] = 0.0;
      local_1f8[0] = 0.0;
      local_1f8[1] = 0.0;
      lVar13 = 0;
      do {
        local_1f8[lVar13] = *(float *)((long)pVVar9->m_data + lVar13 * 4 + lVar22) + 0.01;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      uVar6 = (long)local_1d8.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pVVar16 = local_1d8.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar6) {
        uVar19 = (uVar6 >> 2) * -0x5555555555555555;
        do {
          uVar17 = uVar19 >> 1;
          uVar18 = uVar17;
          if (pVVar16[uVar17].m_data[0] <= (float)local_1b0._0_4_ &&
              (float)local_1b0._0_4_ != pVVar16[uVar17].m_data[0]) {
            uVar18 = ~uVar17 + uVar19;
            pVVar16 = pVVar16 + uVar17 + 1;
          }
          uVar19 = uVar18;
        } while (0 < (long)uVar18);
      }
      if (pVVar16 ==
          local_1d8.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        uVar11 = 0xffffffff;
      }
      else {
        uVar11 = (int)((ulong)((long)pVVar16 -
                              (long)local_1d8.
                                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
      }
      if (((int)uVar11 < 0) ||
         (iVar20 = (int)((long)uVar6 >> 2) * -0x55555555, iVar20 <= (int)uVar11)) {
LAB_014252e6:
        iVar21 = iVar21 + 1;
        if (iVar21 < 5) {
          local_1b0 = (undefined1  [8])local_1e8;
          local_200 = iVar21;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Failure: no matching ",0x15);
          if (supersetName == (char *)0x0) {
            std::ios::clear((int)local_1a8 +
                            (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18))
            ;
          }
          else {
            sVar10 = strlen(supersetName);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,supersetName,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," point found for ",0x11);
          pcVar5 = local_1c0;
          if (local_1c0 == (char *)0x0) {
            std::ios::clear((int)local_1a8 +
                            (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18))
            ;
          }
          else {
            sVar10 = strlen(local_1c0);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," point ",7);
          tcu::operator<<((ostream *)local_1a8,pVVar9 + lVar14);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          iVar21 = local_200;
        }
        else if (iVar21 == 5) {
          local_1b0 = (undefined1  [8])local_1e8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Note: More errors follow",0x18);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        drawTessCoordPoint(local_1b8,local_1fc,pVVar9 + lVar14,errorColor,4);
      }
      else {
        uVar6 = (ulong)uVar11;
        pVVar15 = local_1d8.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar6;
        bVar23 = false;
        do {
          if (local_1f8[0] <
              local_1d8.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar6].m_data[0]) break;
          local_208[4] = '\0';
          local_208[5] = '\0';
          local_208[6] = 0;
          lVar13 = 0;
          do {
            local_208[lVar13 + 4] = *(float *)(local_1b0 + lVar13 * 4) <= pVVar15->m_data[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          if (local_208[4] == '\0') {
LAB_014252c4:
            bVar4 = true;
          }
          else {
            uVar19 = 0;
            do {
              uVar18 = uVar19;
              if (uVar18 == 2) break;
              uVar19 = uVar18 + 1;
            } while (local_208[uVar18 + 5] != '\0');
            if (uVar18 < 2) goto LAB_014252c4;
            local_208[2] = 0;
            local_208[0] = '\0';
            local_208[1] = '\0';
            lVar13 = 0;
            do {
              local_208[lVar13] = pVVar15->m_data[lVar13] <= local_1f8[lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 != 3);
            if (local_208[0] == '\0') goto LAB_014252c4;
            uVar19 = 0;
            do {
              uVar18 = uVar19;
              if (uVar18 == 2) break;
              uVar19 = uVar18 + 1;
            } while (local_208[uVar18 + 1] != '\0');
            if (uVar18 < 2) goto LAB_014252c4;
            bVar4 = false;
            bVar23 = true;
          }
          if (!bVar4) break;
          uVar6 = uVar6 + 1;
          pVVar15 = pVVar15 + 1;
        } while ((long)uVar6 < (long)iVar20);
        if (!bVar23) goto LAB_014252e6;
      }
      lVar14 = lVar14 + 1;
      pVVar9 = (local_1e0->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0xc;
    } while (lVar14 < (int)((ulong)((long)(local_1e0->
                                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9
                                   ) >> 2) * -0x55555555);
    bVar23 = iVar21 == 0;
  }
  if (local_1d8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (Vector<float,_3> *)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar23;
}

Assistant:

static bool oneWayComparePointSets (TestLog&				log,
									tcu::Surface&			errorDst,
									TessPrimitiveType		primitiveType,
									const vector<Vec3>&		subset,
									const vector<Vec3>&		superset,
									const char*				subsetName,
									const char*				supersetName,
									const tcu::RGBA&		errorColor)
{
	const vector<Vec3>	supersetSorted			= sorted(superset, vec3XLessThan);
	const float			epsilon					= 0.01f;
	const int			maxNumFailurePrints		= 5;
	int					numFailuresDetected		= 0;

	for (int subNdx = 0; subNdx < (int)subset.size(); subNdx++)
	{
		const Vec3& subPt = subset[subNdx];

		bool matchFound = false;

		{
			// Binary search the index of the first point in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
			const Vec3	matchMin			= subPt - epsilon;
			const Vec3	matchMax			= subPt + epsilon;
			int			firstCandidateNdx	= binarySearchFirstVec3WithXAtLeast(supersetSorted, matchMin.x());

			if (firstCandidateNdx >= 0)
			{
				// Compare subPt to all points in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
				for (int superNdx = firstCandidateNdx; superNdx < (int)supersetSorted.size() && supersetSorted[superNdx].x() <= matchMax.x(); superNdx++)
				{
					const Vec3& superPt = supersetSorted[superNdx];

					if (tcu::boolAll(tcu::greaterThanEqual	(superPt, matchMin)) &&
						tcu::boolAll(tcu::lessThanEqual		(superPt, matchMax)))
					{
						matchFound = true;
						break;
					}
				}
			}
		}

		if (!matchFound)
		{
			numFailuresDetected++;
			if (numFailuresDetected < maxNumFailurePrints)
				log << TestLog::Message << "Failure: no matching " << supersetName << " point found for " << subsetName << " point " << subPt << TestLog::EndMessage;
			else if (numFailuresDetected == maxNumFailurePrints)
				log << TestLog::Message << "Note: More errors follow" << TestLog::EndMessage;

			drawTessCoordPoint(errorDst, primitiveType, subPt, errorColor, 4);
		}
	}

	return numFailuresDetected == 0;
}